

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void NavUpdateWindowingHighlightWindow(int focus_change_dir)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  ulong uVar4;
  uint i_stop;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar3 = GImGui->NavWindowingTarget;
  if (pIVar3 == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindowingTarget",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2692,"void NavUpdateWindowingHighlightWindow(int)");
  }
  if ((pIVar3->Flags & 0x8000000) == 0) {
    uVar1 = (GImGui->WindowsFocusOrder).Size;
    uVar4 = (ulong)uVar1;
    i_stop = uVar1;
    do {
      uVar4 = uVar4 - 1;
      if ((int)i_stop < 1) {
        i_stop = 0xffffffff;
        break;
      }
      i_stop = i_stop - 1;
    } while ((GImGui->WindowsFocusOrder).Data[uVar4 & 0xffffffff] != pIVar3);
    pIVar3 = FindWindowNavFocusable(i_stop + focus_change_dir,-0x7fffffff,focus_change_dir);
    if ((pIVar3 != (ImGuiWindow *)0x0) ||
       (pIVar3 = FindWindowNavFocusable
                           (focus_change_dir >> 0x1f & uVar1 - 1,i_stop,focus_change_dir),
       pIVar3 != (ImGuiWindow *)0x0)) {
      pIVar2->NavWindowingTargetAnim = pIVar3;
      pIVar2->NavWindowingTarget = pIVar3;
    }
    pIVar2->NavWindowingToggleLayer = false;
  }
  return;
}

Assistant:

static void NavUpdateWindowingHighlightWindow(int focus_change_dir)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget);
    if (g.NavWindowingTarget->Flags & ImGuiWindowFlags_Modal)
        return;

    const int i_current = ImGui::FindWindowFocusIndex(g.NavWindowingTarget);
    ImGuiWindow* window_target = FindWindowNavFocusable(i_current + focus_change_dir, -INT_MAX, focus_change_dir);
    if (!window_target)
        window_target = FindWindowNavFocusable((focus_change_dir < 0) ? (g.WindowsFocusOrder.Size - 1) : 0, i_current, focus_change_dir);
    if (window_target) // Don't reset windowing target if there's a single window in the list
        g.NavWindowingTarget = g.NavWindowingTargetAnim = window_target;
    g.NavWindowingToggleLayer = false;
}